

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O1

void __thiscall ThreadedImageSaver::ThreadedImageSaver(ThreadedImageSaver *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ThreadedImageSaver *local_48;
  code *local_40;
  undefined8 local_38;
  
  (this->images).
  super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->images).
  super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->images).
  super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::condition_variable::condition_variable(&this->cv);
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  iVar1 = std::thread::hardware_concurrency();
  if (iVar1 != 0) {
    uVar3 = 0;
    do {
      local_40 = runThread;
      local_38 = 0;
      local_48 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(ThreadedImageSaver::*)(),ThreadedImageSaver*>
                ((vector<std::thread,std::allocator<std::thread>> *)this,
                 (offset_in_ThreadedImageSaver_to_subr *)&local_40,&local_48);
      uVar3 = uVar3 + 1;
      uVar2 = std::thread::hardware_concurrency();
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

ThreadedImageSaver::ThreadedImageSaver() {
	for (size_t i = 0; i < std::thread::hardware_concurrency(); i++) {
		threads.emplace_back(&ThreadedImageSaver::runThread, this);
	}
}